

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_16::NameGenerator::BeginIfExpr(NameGenerator *this,IfExpr *expr)

{
  Index index;
  
  index = this->label_count_;
  this->label_count_ = index + 1;
  if ((expr->true_).label._M_string_length == 0) {
    GenerateName("$I",index,0,&(expr->true_).label);
  }
  return (Result)Ok;
}

Assistant:

Result NameGenerator::BeginIfExpr(IfExpr* expr) {
  MaybeGenerateName("$I", label_count_++, &expr->true_.label);
  return Result::Ok;
}